

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O0

void __thiscall
avro::
PrimitiveSkipper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
parse(PrimitiveSkipper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,Reader *reader,uint8_t *address)

{
  NoOp *noOp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  string *in_stack_ffffffffffffffb8;
  ReaderImpl<avro::NullValidator> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&local_38);
  ReaderImpl<avro::NullValidator>::readValue(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  noOp = avro::operator<<((NoOp *)&noop,(char (*) [10])"Skipping ");
  avro::operator<<(noOp,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

virtual void parse(Reader &reader, uint8_t *address) const
    {
        T val;
        reader.readValue(val);
        DEBUG_OUT("Skipping " << val);
    }